

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O1

StackLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_stack(NeuralNetworkLayer *this)

{
  StackLayerParams *this_00;
  
  if (this->_oneof_case_[0] != 0x39d) {
    clear_layer(this);
    this->_oneof_case_[0] = 0x39d;
    this_00 = (StackLayerParams *)operator_new(0x20);
    StackLayerParams::StackLayerParams(this_00);
    (this->layer_).stack_ = this_00;
  }
  return (StackLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::StackLayerParams* NeuralNetworkLayer::mutable_stack() {
  if (!has_stack()) {
    clear_layer();
    set_has_stack();
    layer_.stack_ = new ::CoreML::Specification::StackLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.stack)
  return layer_.stack_;
}